

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<double>_>::TPZSkylMatrix
          (TPZSkylMatrix<std::complex<double>_> *this,int64_t dim,TPZVec<long> *skyline)

{
  long lVar1;
  long lVar2;
  
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow = dim;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol = dim;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZSkylMatrix_01853230;
  TPZVec<std::complex<double>_*>::TPZVec(&this->fElem,dim + 1);
  (this->fStorage)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
  (this->fStorage).fStore = (complex<double> *)0x0;
  (this->fStorage).fNElements = 0;
  (this->fStorage).fNAlloc = 0;
  lVar1 = (this->fElem).fNElements;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      (this->fElem).fStore[lVar2] = (complex<double> *)0x0;
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  InitializeElem(skyline,&this->fStorage,&this->fElem);
  return;
}

Assistant:

TPZSkylMatrix<TVar>::TPZSkylMatrix(const int64_t dim, const TPZVec<int64_t> &skyline )
: TPZRegisterClassId(&TPZSkylMatrix::ClassId),TPZMatrix<TVar>( dim, dim ), fElem(dim+1), fStorage(0)
{
	
	// Inicializa a diagonal (vazia).
	fElem.Fill(0);
	InitializeElem(skyline,fStorage,fElem);
}